

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singledocparser.cpp
# Opt level: O2

void __thiscall YAML::SingleDocParser::ParseTag(SingleDocParser *this,string *tag)

{
  Token *token;
  ParserException *this_00;
  string local_90;
  Tag tagInfo;
  
  token = Scanner::peek(this->m_scanner);
  if (tag->_M_string_length == 0) {
    Tag::Tag(&tagInfo,token);
    Tag::Translate_abi_cxx11_(&local_90,&tagInfo,this->m_directives);
    std::__cxx11::string::_M_assign((string *)tag);
    std::__cxx11::string::~string((string *)&local_90);
    Scanner::pop(this->m_scanner);
    Tag::~Tag(&tagInfo);
    return;
  }
  this_00 = (ParserException *)__cxa_allocate_exception(0x40);
  std::__cxx11::string::string
            ((string *)&tagInfo,"cannot assign multiple tags to the same node",
             (allocator *)&local_90);
  ParserException::ParserException(this_00,&token->mark,(string *)&tagInfo);
  __cxa_throw(this_00,&ParserException::typeinfo,BadConversion::~BadConversion);
}

Assistant:

void SingleDocParser::ParseTag(std::string& tag) {
  Token& token = m_scanner.peek();
  if (!tag.empty())
    throw ParserException(token.mark, ErrorMsg::MULTIPLE_TAGS);

  Tag tagInfo(token);
  tag = tagInfo.Translate(m_directives);
  m_scanner.pop();
}